

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
               (CodedInputStream *input,int32 *value)

{
  bool bVar1;
  uint32 temp;
  uint local_c;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_c);
  if (bVar1) {
    *value = -(local_c & 1) ^ local_c >> 1;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int32, WireFormatLite::TYPE_SINT32>(
    io::CodedInputStream* input,
    int32* value) {
  uint32 temp;
  if (!input->ReadVarint32(&temp)) return false;
  *value = ZigZagDecode32(temp);
  return true;
}